

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O3

cppcms_capi_session_pool * cppcms_capi_session_pool_new(void)

{
  cppcms_capi_session_pool *pcVar1;
  
  pcVar1 = (cppcms_capi_session_pool *)operator_new(0x78);
  *(undefined8 *)&pcVar1->e = 0;
  (pcVar1->e).msg = (char *)0x0;
  (pcVar1->e).s_msg._M_dataplus._M_p = (pointer)0x0;
  (pcVar1->e).s_msg._M_string_length = 0;
  (pcVar1->e).s_msg.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pcVar1->e).s_msg.field_2 + 8) = 0;
  (pcVar1->e).msg = "ok";
  (pcVar1->e).s_msg._M_dataplus._M_p = (pointer)&(pcVar1->e).s_msg.field_2;
  (pcVar1->e).s_msg.field_2._M_local_buf[0] = '\0';
  (pcVar1->e).c_msg[0] = '\0';
  (pcVar1->e).c_msg[1] = '\0';
  (pcVar1->e).c_msg[2] = '\0';
  (pcVar1->e).c_msg[3] = '\0';
  (pcVar1->e).c_msg[4] = '\0';
  (pcVar1->e).c_msg[5] = '\0';
  (pcVar1->e).c_msg[6] = '\0';
  (pcVar1->e).c_msg[7] = '\0';
  (pcVar1->e).c_msg[8] = '\0';
  (pcVar1->e).c_msg[9] = '\0';
  (pcVar1->e).c_msg[10] = '\0';
  (pcVar1->e).c_msg[0xb] = '\0';
  (pcVar1->e).c_msg[0xc] = '\0';
  (pcVar1->e).c_msg[0xd] = '\0';
  (pcVar1->e).c_msg[0xe] = '\0';
  (pcVar1->e).c_msg[0xf] = '\0';
  (pcVar1->e).c_msg[0x10] = '\0';
  (pcVar1->e).c_msg[0x11] = '\0';
  (pcVar1->e).c_msg[0x12] = '\0';
  (pcVar1->e).c_msg[0x13] = '\0';
  (pcVar1->e).c_msg[0x14] = '\0';
  (pcVar1->e).c_msg[0x15] = '\0';
  (pcVar1->e).c_msg[0x16] = '\0';
  (pcVar1->e).c_msg[0x17] = '\0';
  (pcVar1->e).c_msg[0x18] = '\0';
  (pcVar1->e).c_msg[0x19] = '\0';
  (pcVar1->e).c_msg[0x1a] = '\0';
  (pcVar1->e).c_msg[0x1b] = '\0';
  (pcVar1->e).c_msg[0x1c] = '\0';
  (pcVar1->e).c_msg[0x1d] = '\0';
  (pcVar1->e).c_msg[0x1e] = '\0';
  (pcVar1->e).c_msg[0x1f] = '\0';
  (pcVar1->e).c_msg[0x20] = '\0';
  (pcVar1->e).c_msg[0x21] = '\0';
  (pcVar1->e).c_msg[0x22] = '\0';
  (pcVar1->e).c_msg[0x23] = '\0';
  (pcVar1->e).c_msg[0x24] = '\0';
  (pcVar1->e).c_msg[0x25] = '\0';
  (pcVar1->e).c_msg[0x26] = '\0';
  (pcVar1->e).c_msg[0x27] = '\0';
  (pcVar1->e).c_msg[0x28] = '\0';
  (pcVar1->e).c_msg[0x29] = '\0';
  (pcVar1->e).c_msg[0x2a] = '\0';
  (pcVar1->e).c_msg[0x2b] = '\0';
  (pcVar1->e).c_msg[0x2c] = '\0';
  (pcVar1->e).c_msg[0x2d] = '\0';
  (pcVar1->e).c_msg[0x2e] = '\0';
  (pcVar1->e).c_msg[0x2f] = '\0';
  (pcVar1->e).c_msg[0x30] = '\0';
  (pcVar1->e).c_msg[0x31] = '\0';
  (pcVar1->e).c_msg[0x32] = '\0';
  (pcVar1->e).c_msg[0x33] = '\0';
  (pcVar1->e).c_msg[0x34] = '\0';
  (pcVar1->e).c_msg[0x35] = '\0';
  (pcVar1->e).c_msg[0x36] = '\0';
  (pcVar1->e).c_msg[0x37] = '\0';
  (pcVar1->e).c_msg[0x38] = '\0';
  (pcVar1->e).c_msg[0x39] = '\0';
  (pcVar1->e).c_msg[0x3a] = '\0';
  (pcVar1->e).c_msg[0x3b] = '\0';
  (pcVar1->e).c_msg[0x3c] = '\0';
  (pcVar1->e).c_msg[0x3d] = '\0';
  (pcVar1->e).c_msg[0x3e] = '\0';
  (pcVar1->e).c_msg[0x3f] = '\0';
  (pcVar1->p).ptr_ = (session_pool *)0x0;
  return pcVar1;
}

Assistant:

cppcms_capi_session_pool *cppcms_capi_session_pool_new()
{
	try {
		return new cppcms_capi_session_pool();
	}catch(...) { return 0; }
}